

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O0

QNode * despot::DESPOT::SelectBestUpperBoundNode(VNode *vnode)

{
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *this;
  size_type sVar1;
  QNode *pQVar2;
  double dVar3;
  QNode *qnode;
  double dStack_20;
  ACT_TYPE action;
  double upperstar;
  int astar;
  VNode *vnode_local;
  
  upperstar._4_4_ = -1;
  dStack_20 = -INFINITY;
  qnode._4_4_ = 0;
  while( true ) {
    this = VNode::children(vnode);
    sVar1 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::size(this);
    if (sVar1 <= (ulong)(long)qnode._4_4_) break;
    pQVar2 = VNode::Child(vnode,qnode._4_4_);
    dVar3 = QNode::upper_bound(pQVar2);
    if (dStack_20 < dVar3) {
      dStack_20 = QNode::upper_bound(pQVar2);
      upperstar._4_4_ = qnode._4_4_;
    }
    qnode._4_4_ = qnode._4_4_ + 1;
  }
  if (-1 < upperstar._4_4_) {
    pQVar2 = VNode::Child(vnode,upperstar._4_4_);
    return pQVar2;
  }
  __assert_fail("astar >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/solver/despot.cpp"
                ,0x20c,"static QNode *despot::DESPOT::SelectBestUpperBoundNode(VNode *)");
}

Assistant:

QNode* DESPOT::SelectBestUpperBoundNode(VNode* vnode) {
	int astar = -1;
	double upperstar = Globals::NEG_INFTY;
	for (ACT_TYPE action = 0; action < vnode->children().size(); action++) {
		QNode* qnode = vnode->Child(action);

		if (qnode->upper_bound() > upperstar) {
			upperstar = qnode->upper_bound();
			astar = action;
		}
	}
	assert(astar >= 0);
	return vnode->Child(astar);
}